

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_feb727::CTransactionSignatureSerializer<CTransaction>::SerializeInput<HashWriter>
          (CTransactionSignatureSerializer<CTransaction> *this,HashWriter *s,uint nInput)

{
  long lVar1;
  int in_EDX;
  vector<CTxIn,_std::allocator<CTxIn>_> *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  HashWriter *in_stack_ffffffffffffff78;
  size_type in_stack_ffffffffffffff80;
  vector<CTxIn,_std::allocator<CTxIn>_> *in_stack_ffffffffffffff88;
  undefined4 local_3c;
  HashWriter *in_stack_ffffffffffffffd8;
  CTransactionSignatureSerializer<CTransaction> *in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_3c = in_EDX;
  if ((*(byte *)(in_RDI + 0x14) & 1) != 0) {
    local_3c = *(int *)(in_RDI + 0x10);
  }
  std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
            (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  Serialize<HashWriter,_COutPoint>(in_stack_ffffffffffffff78,(COutPoint *)0x8b651c);
  if (local_3c == *(int *)(in_RDI + 0x10)) {
    SerializeScriptCode<HashWriter>(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  }
  else {
    CScript::CScript((CScript *)in_stack_ffffffffffffff78);
    Serialize<HashWriter,_CScript>(in_stack_ffffffffffffff78,(CScript *)0x8b655f);
    CScript::~CScript((CScript *)in_stack_ffffffffffffff78);
  }
  if ((local_3c == *(int *)(in_RDI + 0x10)) ||
     (((*(byte *)(in_RDI + 0x15) & 1) == 0 && ((*(byte *)(in_RDI + 0x16) & 1) == 0)))) {
    std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[](in_RSI,in_stack_ffffffffffffff80);
    ::Serialize<HashWriter>(in_stack_ffffffffffffff78,0);
  }
  else {
    ::Serialize<HashWriter>(in_stack_ffffffffffffff78,0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SerializeInput(S &s, unsigned int nInput) const {
        // In case of SIGHASH_ANYONECANPAY, only the input being signed is serialized
        if (fAnyoneCanPay)
            nInput = nIn;
        // Serialize the prevout
        ::Serialize(s, txTo.vin[nInput].prevout);
        // Serialize the script
        if (nInput != nIn)
            // Blank out other inputs' signatures
            ::Serialize(s, CScript());
        else
            SerializeScriptCode(s);
        // Serialize the nSequence
        if (nInput != nIn && (fHashSingle || fHashNone))
            // let the others update at will
            ::Serialize(s, int32_t{0});
        else
            ::Serialize(s, txTo.vin[nInput].nSequence);
    }